

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::
ParseStream<0u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is)

{
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  ParseResult PVar6;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  ClearStackOnExit local_58;
  undefined8 local_50;
  void *local_48;
  void *pvStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  undefined4 local_10;
  
  local_50 = *(undefined8 *)(this + 0x20);
  local_48 = (void *)0x0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0x100;
  local_20 = 0;
  local_18 = 0;
  local_10 = 2;
  local_58.d_ = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 *)this;
  PVar6 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&local_50,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ParseErrorCode *)(this + 0x50) = PVar6.code_;
  *(size_t *)(this + 0x58) = PVar6.offset_;
  if (PVar6.code_ == kParseErrorNone) {
    lVar4 = *(long *)(this + 0x38);
    pGVar1 = (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)(lVar4 + -0x10);
    *(GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      **)(this + 0x38) = pGVar1;
    if (pGVar1 != this) {
      uVar2 = *(undefined2 *)(lVar4 + -2);
      *(undefined2 *)(lVar4 + -2) = 0;
      uVar5 = *(undefined8 *)pGVar1;
      uVar3 = *(undefined4 *)(lVar4 + -8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(lVar4 + -4);
      *(undefined4 *)(this + 8) = uVar3;
      *(undefined8 *)this = uVar5;
      *(undefined2 *)(this + 0xe) = uVar2;
    }
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&local_58);
  free(pvStack_40);
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }